

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O2

UBool CnvExtAddTable(NewConverter *cnvData,UCMTable *table,UConverterStaticData *staticData)

{
  short *psVar1;
  char cVar2;
  uint uVar3;
  int32_t *piVar4;
  UChar32 *pUVar5;
  UCMapping *pUVar6;
  int *piVar7;
  UBool UVar8;
  uint32_t defaultValue;
  uint32_t value;
  UToolMemory *pUVar9;
  UCMapping *pUVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  UChar32 c;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  
  if ((table->unicodeMask & 2) == 0) {
    staticData->conversionType = '\x02';
    pUVar10 = table->mappings;
    piVar4 = table->reverseMap;
    uVar3 = table->mappingsLength;
    uVar13 = 0;
    uVar19 = 0;
    if (0 < (int)uVar3) {
      uVar19 = (ulong)uVar3;
    }
    for (; uVar20 = uVar19, uVar19 != uVar13; uVar13 = uVar13 + 1) {
      cVar2 = pUVar10[piVar4[uVar13]].f;
      if ((cVar2 != '\0') && (cVar2 != '\x03')) {
        uVar19 = uVar13;
        uVar20 = uVar13 & 0xffffffff;
        break;
      }
    }
    for (; iVar15 = (int)uVar20, (long)uVar19 < (long)(int)uVar3; uVar19 = uVar19 + 1) {
      cVar2 = pUVar10[piVar4[uVar19]].f;
      if ((cVar2 == '\x03') || (cVar2 == '\0')) {
        uVar20 = (ulong)(iVar15 + 1);
        piVar4[iVar15] = piVar4[uVar19];
      }
    }
    pUVar9 = utm_open("cnv extension toUTable",0x10000,0x1f0000,4);
    cnvData[1].isValid = (_func_UBool_NewConverter_ptr_uint8_t_ptr_int32_t *)pUVar9;
    pUVar9 = utm_open("cnv extension toUUChars",0x10000,0x40000,2);
    cnvData[1].addTable =
         (_func_UBool_NewConverter_ptr_UCMTable_ptr_UConverterStaticData_ptr *)pUVar9;
    UVar8 = generateToUTable((CnvExtData *)cnvData,table,0,iVar15,0,0);
    if (UVar8 != '\0') {
      pUVar10 = table->mappings;
      piVar4 = table->reverseMap;
      iVar15 = table->mappingsLength;
      if (table->mappingsLength < 1) {
        iVar15 = 0;
      }
      iVar17 = 0;
      for (iVar12 = 0; lVar11 = (long)iVar17, iVar12 != iVar15; iVar12 = iVar12 + 1) {
        bVar14 = pUVar10->f;
        if ((char)bVar14 < '\0') {
LAB_001e48fe:
          if ((bVar14 == 4) || ((bVar14 == 2 && (pUVar10->bLen == '\x01')))) goto LAB_001e4917;
        }
        else {
          bVar14 = bVar14 & 0xf;
          pUVar10->f = bVar14;
          if (1 < bVar14) goto LAB_001e48fe;
LAB_001e4917:
          iVar17 = iVar17 + 1;
          piVar4[lVar11] = iVar12;
          cVar2 = pUVar10->uLen;
          if (1 < (long)cVar2) {
            iVar18 = pUVar10->u;
            pUVar5 = table->codePoints;
            iVar16 = 2;
            for (lVar11 = 1; cVar2 != lVar11; lVar11 = lVar11 + 1) {
              uVar3 = pUVar5[iVar18 + lVar11];
              lVar21 = (long)iVar16;
              if (uVar3 < 0x10000) {
                iVar16 = iVar16 + 1;
                *(ushort *)((long)pUVar5 + lVar21 * 2 + (long)iVar18 * 4) = (ushort)uVar3;
              }
              else {
                *(short *)((long)pUVar5 + lVar21 * 2 + (long)iVar18 * 4) =
                     (short)(uVar3 >> 10) + -0x2840;
                iVar16 = iVar16 + 2;
                *(ushort *)((long)pUVar5 + lVar21 * 2 + (long)iVar18 * 4 + 2) =
                     (ushort)uVar3 & 0x3ff | 0xdc00;
              }
            }
            pUVar10->uLen = (int8_t)iVar16;
          }
        }
        pUVar10 = pUVar10 + 1;
      }
      pUVar9 = utm_open("cnv extension fromUTableUChars",0x10000,0x1000000,2);
      cnvData[1].write =
           (_func_uint32_t_NewConverter_ptr_UConverterStaticData_ptr_UNewDataMemory_ptr_int32_t *)
           pUVar9;
      pUVar9 = utm_open("cnv extension fromUTableValues",0x10000,0x1000000,4);
      cnvData[2].close = (_func_void_NewConverter_ptr *)pUVar9;
      pUVar9 = utm_open("cnv extension fromUBytes",0x10000,0x1000000,1);
      cnvData[2].isValid = (_func_UBool_NewConverter_ptr_uint8_t_ptr_int32_t *)pUVar9;
      *(undefined8 *)((long)&cnvData[0x7002].addTable + 4) = 0x1000000040;
      *(undefined4 *)((long)&cnvData[0x5002].addTable + 4) = 0x80000001;
      *(undefined4 *)((long)&cnvData[0x7002].write + 4) = 2;
      utm_alloc((UToolMemory *)cnvData[1].write);
      utm_alloc((UToolMemory *)cnvData[2].close);
      if (iVar17 == 0) {
LAB_001e4b94:
        uVar3 = *(uint *)&cnvData[0x7002].addTable;
        uVar13 = 0;
        uVar19 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar19 = uVar13;
        }
        for (; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          psVar1 = (short *)((long)&cnvData[2].addTable + uVar13 * 2);
          *psVar1 = *psVar1 + (short)uVar3;
        }
        return '\x01';
      }
      pUVar6 = table->mappings;
      piVar7 = table->reverseMap;
      pUVar10 = pUVar6 + *piVar7;
      if (pUVar6[*piVar7].uLen != '\x01') {
        pUVar10 = (UCMapping *)(table->codePoints + pUVar10->u);
      }
      c = pUVar10->u;
      iVar15 = 0;
      do {
        while( true ) {
          if (iVar17 <= iVar15) goto LAB_001e4b94;
          lVar21 = (long)iVar15;
          iVar12 = c;
          iVar18 = iVar15;
          while ((lVar21 = lVar21 + 1, iVar16 = iVar18, iVar12 == c &&
                 (iVar16 = iVar17, iVar12 = c, lVar21 < lVar11))) {
            pUVar10 = pUVar6 + piVar7[lVar21];
            if (pUVar6[piVar7[lVar21]].uLen != '\x01') {
              pUVar10 = (UCMapping *)(table->codePoints + pUVar10->u);
            }
            iVar12 = pUVar10->u;
            iVar18 = iVar18 + 1;
          }
          iVar18 = piVar7[iVar15];
          defaultValue = 0;
          if (pUVar6[iVar18].uLen == '\x01') {
            iVar15 = iVar15 + 1;
            if ((iVar15 < iVar16) && (pUVar6[piVar7[iVar15]].uLen == '\x01')) {
              fwrite("error: multiple mappings from same Unicode code points\n",0x37,1,_stderr);
              ucm_printMapping(table,pUVar6 + iVar18,(FILE *)_stderr);
              ucm_printMapping(table,pUVar6 + piVar7[iVar15],(FILE *)_stderr);
              return '\0';
            }
            defaultValue = getFromUBytesValue((CnvExtData *)cnvData,table,pUVar6 + iVar18);
          }
          if (iVar15 != iVar16) break;
          addFromUTrieEntry((CnvExtData *)cnvData,c,defaultValue);
          c = iVar12;
          iVar15 = iVar16;
        }
        value = utm_countItems((UToolMemory *)cnvData[2].close);
        addFromUTrieEntry((CnvExtData *)cnvData,c,value);
        UVar8 = generateFromUTable((CnvExtData *)cnvData,table,iVar15,iVar16,2,defaultValue);
        c = iVar12;
        iVar15 = iVar16;
      } while (UVar8 != '\0');
    }
  }
  else {
    fwrite("error: contains mappings for surrogate code points\n",0x33,1,_stderr);
  }
  return '\0';
}

Assistant:

static UBool
CnvExtAddTable(NewConverter *cnvData, UCMTable *table, UConverterStaticData *staticData) {
    CnvExtData *extData;

    if(table->unicodeMask&UCNV_HAS_SURROGATES) {
        fprintf(stderr, "error: contains mappings for surrogate code points\n");
        return FALSE;
    }

    staticData->conversionType=UCNV_MBCS;

    extData=(CnvExtData *)cnvData;

    /*
     * assume that the table is sorted
     *
     * call the functions in this order because
     * makeToUTable() modifies the original reverseMap,
     * makeFromUTable() writes a whole new mapping into reverseMap
     */
    return
        makeToUTable(extData, table) &&
        makeFromUTable(extData, table);
}